

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O3

void google::protobuf::internal::VerifyVersion
               (int headerVersion,int minLibraryVersion,char *filename)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int version;
  int version_00;
  int version_01;
  int version_02;
  string local_a0;
  string local_80;
  LogMessage local_60;
  
  if (0x2de9e9 < minLibraryVersion) {
    psVar1 = &local_60.message_;
    local_60.level_ = LOGLEVEL_FATAL;
    local_60.filename_ =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/stubs/common.cc"
    ;
    local_60.line_ = 0x4b;
    paVar2 = &local_60.message_.field_2;
    local_60.message_._M_string_length = 0;
    local_60.message_.field_2._M_local_buf[0] = '\0';
    local_60.message_._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::append((char *)psVar1);
    VersionString_abi_cxx11_(&local_80,(internal *)(ulong)(uint)minLibraryVersion,version);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_80._M_dataplus._M_p);
    std::__cxx11::string::append((char *)psVar1);
    VersionString_abi_cxx11_(&local_a0,(internal *)0x2de9e9,version_00);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_a0._M_dataplus._M_p);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    LogMessage::Finish(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.message_._M_dataplus._M_p != paVar2) {
      operator_delete(local_60.message_._M_dataplus._M_p);
    }
  }
  if (headerVersion < 0x2de9e8) {
    psVar1 = &local_60.message_;
    local_60.level_ = LOGLEVEL_FATAL;
    local_60.filename_ =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/stubs/common.cc"
    ;
    local_60.line_ = 0x56;
    paVar2 = &local_60.message_.field_2;
    local_60.message_._M_string_length = 0;
    local_60.message_.field_2._M_local_buf[0] = '\0';
    local_60.message_._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::append((char *)psVar1);
    VersionString_abi_cxx11_(&local_80,(internal *)(ulong)(uint)headerVersion,version_01);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_80._M_dataplus._M_p);
    std::__cxx11::string::append((char *)psVar1);
    VersionString_abi_cxx11_(&local_a0,(internal *)0x2de9e9,version_02);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_a0._M_dataplus._M_p);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    LogMessage::Finish(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.message_._M_dataplus._M_p != paVar2) {
      operator_delete(local_60.message_._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void VerifyVersion(int headerVersion,
                   int minLibraryVersion,
                   const char* filename) {
  if (GOOGLE_PROTOBUF_VERSION < minLibraryVersion) {
    // Library is too old for headers.
    GOOGLE_LOG(FATAL)
      << "This program requires version " << VersionString(minLibraryVersion)
      << " of the Protocol Buffer runtime library, but the installed version "
         "is " << VersionString(GOOGLE_PROTOBUF_VERSION) << ".  Please update "
         "your library.  If you compiled the program yourself, make sure that "
         "your headers are from the same version of Protocol Buffers as your "
         "link-time library.  (Version verification failed in \""
      << filename << "\".)";
  }
  if (headerVersion < kMinHeaderVersionForLibrary) {
    // Headers are too old for library.
    GOOGLE_LOG(FATAL)
      << "This program was compiled against version "
      << VersionString(headerVersion) << " of the Protocol Buffer runtime "
         "library, which is not compatible with the installed version ("
      << VersionString(GOOGLE_PROTOBUF_VERSION) <<  ").  Contact the program "
         "author for an update.  If you compiled the program yourself, make "
         "sure that your headers are from the same version of Protocol Buffers "
         "as your link-time library.  (Version verification failed in \""
      << filename << "\".)";
  }
}